

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

int32_t * icu_63::TZEnumeration::getMap(USystemTimeZoneType type,int32_t *len,UErrorCode *ec)

{
  UBool UVar1;
  int32_t *local_30;
  int32_t *m;
  UErrorCode *ec_local;
  int32_t *len_local;
  int32_t *piStack_10;
  USystemTimeZoneType type_local;
  
  *len = 0;
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    if (type == UCAL_ZONE_TYPE_ANY) {
      umtx_initOnce<USystemTimeZoneType>(&gSystemZonesInitOnce,initMap,UCAL_ZONE_TYPE_ANY,ec);
      local_30 = MAP_SYSTEM_ZONES;
      *len = LEN_SYSTEM_ZONES;
    }
    else if (type == UCAL_ZONE_TYPE_CANONICAL) {
      umtx_initOnce<USystemTimeZoneType>
                (&gCanonicalZonesInitOnce,initMap,UCAL_ZONE_TYPE_CANONICAL,ec);
      local_30 = MAP_CANONICAL_SYSTEM_ZONES;
      *len = LEN_CANONICAL_SYSTEM_ZONES;
    }
    else if (type == UCAL_ZONE_TYPE_CANONICAL_LOCATION) {
      umtx_initOnce<USystemTimeZoneType>
                (&gCanonicalLocationZonesInitOnce,initMap,UCAL_ZONE_TYPE_CANONICAL_LOCATION,ec);
      local_30 = MAP_CANONICAL_SYSTEM_LOCATION_ZONES;
      *len = LEN_CANONICAL_SYSTEM_LOCATION_ZONES;
    }
    else {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      local_30 = (int32_t *)0x0;
      *len = 0;
    }
    piStack_10 = local_30;
  }
  else {
    piStack_10 = (int32_t *)0x0;
  }
  return piStack_10;
}

Assistant:

static int32_t* getMap(USystemTimeZoneType type, int32_t& len, UErrorCode& ec) {
        len = 0;
        if (U_FAILURE(ec)) {
            return NULL;
        }
        int32_t* m = NULL;
        switch (type) {
        case UCAL_ZONE_TYPE_ANY:
            umtx_initOnce(gSystemZonesInitOnce, &initMap, type, ec);
            m = MAP_SYSTEM_ZONES;
            len = LEN_SYSTEM_ZONES;
            break;
        case UCAL_ZONE_TYPE_CANONICAL:
            umtx_initOnce(gCanonicalZonesInitOnce, &initMap, type, ec);
            m = MAP_CANONICAL_SYSTEM_ZONES;
            len = LEN_CANONICAL_SYSTEM_ZONES;
            break;
        case UCAL_ZONE_TYPE_CANONICAL_LOCATION:
            umtx_initOnce(gCanonicalLocationZonesInitOnce, &initMap, type, ec);
            m = MAP_CANONICAL_SYSTEM_LOCATION_ZONES;
            len = LEN_CANONICAL_SYSTEM_LOCATION_ZONES;
            break;
        default:
            ec = U_ILLEGAL_ARGUMENT_ERROR;
            m = NULL;
            len = 0;
            break;
        }
        return m;
    }